

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_padding.cpp
# Opt level: O2

Padder icu_63::number::impl::Padder::forProperties(DecimalFormatProperties *properties)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  UNumberFormatPadPosition UVar5;
  Padder PVar6;
  
  sVar1 = (properties->padString).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (properties->padString).fUnion.fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  if (iVar2 < 1) {
    uVar4 = 0x2000000000;
  }
  else {
    uVar3 = UnicodeString::char32At(&properties->padString,0);
    uVar4 = (ulong)uVar3 << 0x20;
  }
  UVar5 = UNUM_PAD_BEFORE_PREFIX;
  if ((properties->padPosition).fNull == false) {
    UVar5 = (properties->padPosition).fValue;
  }
  PVar6._0_8_ = uVar4 | (uint)properties->formatWidth;
  PVar6.fUnion.padding.fPosition = UVar5;
  return PVar6;
}

Assistant:

Padder Padder::forProperties(const DecimalFormatProperties& properties) {
    UChar32 padCp;
    if (properties.padString.length() > 0) {
        padCp = properties.padString.char32At(0);
    } else {
        padCp = kFallbackPaddingString[0];
    }
    return {padCp, properties.formatWidth, properties.padPosition.getOrDefault(UNUM_PAD_BEFORE_PREFIX)};
}